

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000014b650 = 0x2e2e2e2e2e2e2e;
    uRam000000000014b657 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0014b640 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000014b648 = 0x2e2e2e2e2e2e2e;
    DAT_0014b64f = 0x2e;
    _DAT_0014b630 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000014b638 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0014b620 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000014b628 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam000000000014b618 = 0x2e2e2e2e2e2e2e2e;
    DAT_0014b65f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }